

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

QueueType * __thiscall
slang::BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
          (BumpAllocator *this,Type *args,uint *args_1)

{
  QueueType *pQVar1;
  size_t in_RDX;
  size_t in_RSI;
  Type *in_RDI;
  QueueType *unaff_retaddr;
  
  pQVar1 = (QueueType *)allocate((BumpAllocator *)in_RDI,in_RSI,in_RDX);
  slang::ast::QueueType::QueueType(unaff_retaddr,in_RDI,(uint32_t)(in_RSI >> 0x20));
  return pQVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }